

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O0

void __thiscall
cinject::ComponentBuilderBase<ICrawler,IWaterConsumer,Snake>::
registerType<Snake,cinject::InstanceStorage<Snake,cinject::ConstructorFactory<Snake,void>>,ICrawler,IWaterConsumer,Snake>
          (ComponentBuilderBase<ICrawler,IWaterConsumer,Snake> *this,
          shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
          *instanceStorage)

{
  shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  local_48 [2];
  shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_> local_28;
  shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_> *local_18;
  shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
  *instanceStorage_local;
  ComponentBuilderBase<ICrawler,_IWaterConsumer,_Snake> *this_local;
  
  local_18 = instanceStorage;
  instanceStorage_local =
       (shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_> *)
       this;
  std::shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>::
  shared_ptr(&local_28,instanceStorage);
  addRegistration<Snake,cinject::InstanceStorage<Snake,cinject::ConstructorFactory<Snake,void>>,ICrawler>
            (this,&local_28);
  std::shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>::
  ~shared_ptr(&local_28);
  std::shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>::
  shared_ptr(local_48,instanceStorage);
  registerType<Snake,cinject::InstanceStorage<Snake,cinject::ConstructorFactory<Snake,void>>,IWaterConsumer,Snake>
            (this,local_48);
  std::shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>::
  ~shared_ptr(local_48);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }